

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
upb::generator::StripExtension_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view fname)

{
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> *__a;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  undefined1 local_29;
  string_view fname_local;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  fname_local._M_str = (char *)fname._M_len;
  fname_local._M_len = (size_t)this;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&fname_local,'.',0xffffffffffffffff);
  if (__n == 0xffffffffffffffff) {
    __t = &fname_local;
    __a = &local_18;
  }
  else {
    local_18 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&fname_local,0,__n);
    __t = &local_18;
    __a = (basic_string_view<char,_std::char_traits<char>_> *)&local_29;
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__t,(allocator<char> *)__a);
  return __return_storage_ptr__;
}

Assistant:

std::string StripExtension(absl::string_view fname) {
  size_t lastdot = fname.find_last_of('.');
  if (lastdot == std::string::npos) {
    return std::string(fname);
  }
  return std::string(fname.substr(0, lastdot));
}